

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerConfig.cpp
# Opt level: O0

RayTracerConfig * RayTracerConfig::defaultConfig(void)

{
  RayTracerConfig *in_RDI;
  value_type local_144;
  value_type local_120;
  value_type local_fc;
  value_type local_d8;
  value_type local_b4;
  value_type local_90;
  value_type local_6c;
  value_type local_44;
  undefined4 local_2c;
  undefined4 uStack_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 uStack_1c;
  undefined4 local_18;
  undefined1 local_11;
  RayTracerConfig *config;
  
  local_11 = 0;
  RayTracerConfig(in_RDI);
  (in_RDI->super_BaseConfig).antiAliasing = 2;
  (in_RDI->super_BaseConfig).maxRecursionLevel = 1;
  (in_RDI->super_BaseConfig).ambientCoefficient = 0.1;
  (in_RDI->super_BaseConfig).imageX = 0x200;
  (in_RDI->super_BaseConfig).imageY = 0x300;
  (in_RDI->super_BaseConfig).imageZ = 0x400;
  local_20 = 0;
  uStack_1c = 0;
  local_18 = 0;
  (in_RDI->super_BaseConfig).observer.z = 0.0;
  (in_RDI->super_BaseConfig).observer.x = 0.0;
  (in_RDI->super_BaseConfig).observer.y = 0.0;
  local_2c = 0x447a0000;
  uStack_28 = 0x44fa0000;
  local_24 = 0x451c4000;
  (in_RDI->super_BaseConfig).light.z = 2500.0;
  (in_RDI->super_BaseConfig).light.x = 1000.0;
  (in_RDI->super_BaseConfig).light.y = 2000.0;
  local_44.center.x = 2500.0;
  local_44.center.y = -200.0;
  local_44.center.z = -600.0;
  local_44.radius = 600.0;
  local_44.color.r = 200;
  local_44.color.g = '\0';
  local_44.color.b = '\0';
  local_44.reflectionCoefficient = 0.3;
  std::vector<Sphere,_std::allocator<Sphere>_>::push_back(&in_RDI->spheres,&local_44);
  local_6c.center.x = 2000.0;
  local_6c.center.y = 0.0;
  local_6c.center.z = 800.0;
  local_6c.radius = 400.0;
  local_6c.color.r = '\0';
  local_6c.color.g = 200;
  local_6c.color.b = '\0';
  local_6c.reflectionCoefficient = 0.1;
  std::vector<Sphere,_std::allocator<Sphere>_>::push_back(&in_RDI->spheres,&local_6c);
  local_90.P.x = 6000.0;
  local_90.P.y = 0.0;
  local_90.P.z = 0.0;
  local_90.normal.x = -1.0;
  local_90.normal.y = 0.0;
  local_90.normal.z = 0.0;
  local_90.d = 6000.0;
  local_90.color.r = 0xff;
  local_90.color.g = 0xff;
  local_90.color.b = 0xff;
  local_90.reflectionCoefficient = 1.0;
  std::vector<Plane,_std::allocator<Plane>_>::push_back(&in_RDI->planes,&local_90);
  local_b4.P.x = -2000.0;
  local_b4.P.y = 0.0;
  local_b4.P.z = 0.0;
  local_b4.normal.x = 1.0;
  local_b4.normal.y = 0.0;
  local_b4.normal.z = 0.0;
  local_b4.d = 2000.0;
  local_b4.color.r = 0xf5;
  local_b4.color.g = 0xde;
  local_b4.color.b = 0xb3;
  local_b4.reflectionCoefficient = 0.0;
  std::vector<Plane,_std::allocator<Plane>_>::push_back(&in_RDI->planes,&local_b4);
  local_d8.P.x = 0.0;
  local_d8.P.y = 3000.0;
  local_d8.P.z = 0.0;
  local_d8.normal.x = 0.0;
  local_d8.normal.y = -1.0;
  local_d8.normal.z = 0.0;
  local_d8.d = 3000.0;
  local_d8.color.r = 0xff;
  local_d8.color.g = 'i';
  local_d8.color.b = 0xb4;
  local_d8.reflectionCoefficient = 0.05;
  std::vector<Plane,_std::allocator<Plane>_>::push_back(&in_RDI->planes,&local_d8);
  local_fc.P.x = 0.0;
  local_fc.P.y = -800.0;
  local_fc.P.z = 0.0;
  local_fc.normal.x = 0.0;
  local_fc.normal.y = 1.0;
  local_fc.normal.z = 0.0;
  local_fc.d = 800.0;
  local_fc.color.r = 'd';
  local_fc.color.g = 'd';
  local_fc.color.b = 200;
  local_fc.reflectionCoefficient = 0.05;
  std::vector<Plane,_std::allocator<Plane>_>::push_back(&in_RDI->planes,&local_fc);
  local_120.P.x = 0.0;
  local_120.P.y = 0.0;
  local_120.P.z = -2500.0;
  local_120.normal.x = 0.0;
  local_120.normal.y = 0.0;
  local_120.normal.z = 1.0;
  local_120.d = 2500.0;
  local_120.color.r = ' ';
  local_120.color.g = 0xb2;
  local_120.color.b = 0xaa;
  local_120.reflectionCoefficient = 0.05;
  std::vector<Plane,_std::allocator<Plane>_>::push_back(&in_RDI->planes,&local_120);
  local_144.P.x = 0.0;
  local_144.P.y = 0.0;
  local_144.P.z = 3500.0;
  local_144.normal.x = 0.0;
  local_144.normal.y = 0.0;
  local_144.normal.z = -1.0;
  local_144.d = 3500.0;
  local_144.color.r = ' ';
  local_144.color.g = 0xb2;
  local_144.color.b = 0xaa;
  local_144.reflectionCoefficient = 0.05;
  std::vector<Plane,_std::allocator<Plane>_>::push_back(&in_RDI->planes,&local_144);
  return in_RDI;
}

Assistant:

RayTracerConfig RayTracerConfig::defaultConfig()
{
  RayTracerConfig config;

  config.antiAliasing = 2;
  config.maxRecursionLevel = 1;
  config.ambientCoefficient = 0.1;
  config.imageX = 512;
  config.imageY = 384 * 2;
  config.imageZ = 512 * 2;
  config.observer = {0, 0, 0};
  config.light = {1000, 2000, 2500};

  // red
  config.spheres.push_back({{2500, -200, -600}, 600, {200, 0, 0}, 0.3});
  // green
  config.spheres.push_back({{2000, 0, 800}, 400, {0, 200, 0}, 0.1});

  // Plane has one face!
  // front
  config.planes.push_back({{6000, 0, 0}, {-1, 0, 0}, 6000, {255, 255, 255}, 1});
  // back
  config.planes.push_back({{-2000, 0, 0}, {1, 0, 0}, 2000, {245, 222, 179}});
  // top
  config.planes.push_back({{0, 3000, 0}, {0, -1, 0}, 3000, {255, 105, 180}, 0.05});
  // bottom
  config.planes.push_back({{0, -800, 0}, {0, 1, 0}, 800, {100, 100, 200}, 0.05});
  // left
  config.planes.push_back({{0, 0, -2500}, {0, 0, 1}, 2500, {32, 178, 170}, 0.05});
  // right
  config.planes.push_back({{0, 0, 3500}, {0, 0, -1}, 3500, {32, 178, 170}, 0.05});

  return config;
}